

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void __thiscall Fl_Widget::redraw_label(Fl_Widget *this)

{
  Fl_Boxtype FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Align FVar5;
  int iVar6;
  Fl_Window *pFVar7;
  int local_30;
  int local_2c;
  int local_20;
  int local_1c;
  int H;
  int W;
  int Y;
  int X;
  Fl_Widget *this_local;
  
  _Y = this;
  pFVar7 = window(this);
  if (pFVar7 != (Fl_Window *)0x0) {
    FVar1 = box(this);
    if (FVar1 == FL_NO_BOX) {
      iVar2 = x(this);
      if (iVar2 < 1) {
        local_2c = 0;
      }
      else {
        local_2c = x(this);
        local_2c = local_2c + -1;
      }
      W = local_2c;
      iVar2 = y(this);
      if (iVar2 < 1) {
        local_30 = 0;
      }
      else {
        local_30 = y(this);
        local_30 = local_30 + -1;
      }
      H = local_30;
      pFVar7 = window(this);
      iVar6 = W;
      iVar2 = H;
      iVar3 = w(this);
      iVar4 = h(this);
      damage((Fl_Widget *)pFVar7,0x80,iVar6,iVar2,iVar3 + 2,iVar4 + 2);
    }
    FVar5 = align(this);
    if ((FVar5 != 0) && (FVar5 = align(this), (FVar5 & 0x10) == 0)) {
      pFVar7 = window(this);
      iVar2 = Fl_Window::shown(pFVar7);
      if (iVar2 != 0) {
        local_1c = 0;
        local_20 = 0;
        Fl_Label::measure(&this->label_,&local_1c,&local_20);
        local_1c = local_1c + 5;
        local_20 = local_20 + 5;
        FVar5 = align(this);
        switch(FVar5 & 0xf) {
        case 1:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar6 = iVar6 - local_1c;
          iVar3 = y(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2 + iVar6 / 2,iVar3 - local_20,local_1c,local_20);
          return;
        case 2:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar6 = iVar6 - local_1c;
          iVar3 = y(this);
          iVar4 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2 + iVar6 / 2,iVar3 + iVar4,local_1c,local_20);
          return;
        default:
          pFVar7 = window(this);
          damage((Fl_Widget *)pFVar7,0x80);
          return;
        case 4:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar2 = iVar2 - local_1c;
          iVar6 = y(this);
          iVar3 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6 + (iVar3 - local_20) / 2,local_1c,local_20);
          return;
        case 5:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = y(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6 - local_20,local_1c,local_20);
          return;
        case 6:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = y(this);
          iVar3 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6 + iVar3,local_1c,local_20);
          return;
        case 7:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar2 = iVar2 - local_1c;
          iVar6 = y(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6,local_1c,local_20);
          return;
        case 8:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar3 = y(this);
          iVar4 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2 + iVar6,iVar3 + (iVar4 - local_20) / 2,local_1c,
                 local_20);
          return;
        case 9:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar2 = (iVar2 + iVar6) - local_1c;
          iVar6 = y(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6 - local_20,local_1c,local_20);
          return;
        case 10:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar2 = (iVar2 + iVar6) - local_1c;
          iVar6 = y(this);
          iVar3 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,iVar6 + iVar3,local_1c,local_20);
          return;
        case 0xb:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar3 = y(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2 + iVar6,iVar3,local_1c,local_20);
          return;
        case 0xd:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar2 = iVar2 - local_1c;
          iVar6 = y(this);
          iVar3 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2,(iVar6 + iVar3) - local_20,local_1c,local_20);
          return;
        case 0xe:
          pFVar7 = window(this);
          iVar2 = x(this);
          iVar6 = w(this);
          iVar3 = y(this);
          iVar4 = h(this);
          damage((Fl_Widget *)pFVar7,'\x02',iVar2 + iVar6,(iVar3 + iVar4) - local_20,local_1c,
                 local_20);
          return;
        }
      }
    }
    damage(this,0x80);
  }
  return;
}

Assistant:

void Fl_Widget::redraw_label() {
  if (window()) {
    if (box() == FL_NO_BOX) {
      // Widgets with the FL_NO_BOX boxtype need a parent to
      // redraw, since it is responsible for redrawing the
      // background...
      int X = x() > 0 ? x() - 1 : 0;
      int Y = y() > 0 ? y() - 1 : 0;
      window()->damage(FL_DAMAGE_ALL, X, Y, w() + 2, h() + 2);
    }

    if (align() && !(align() & FL_ALIGN_INSIDE) && window()->shown()) {
      // If the label is not inside the widget, compute the location of
      // the label and redraw the window within that bounding box...
      int W = 0, H = 0;
      label_.measure(W, H);
      W += 5; // Add a little to the size of the label to cover overflow
      H += 5;

      // FIXME:
      // This assumes that measure() returns the correct outline, which it does
      // not in all possible cases of alignment combinedwith image and symbols.
      switch (align() & 0x0f) {
        case FL_ALIGN_TOP_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x(), y()-H, W, H); break;
        case FL_ALIGN_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()+(w()-W)/2, y()-H, W, H); break;
        case FL_ALIGN_TOP_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w()-W, y()-H, W, H); break;
        case FL_ALIGN_LEFT_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y(), W, H); break;
        case FL_ALIGN_RIGHT_TOP:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y(), W, H); break;
        case FL_ALIGN_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y()+(h()-H)/2, W, H); break;
        case FL_ALIGN_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y()+(h()-H)/2, W, H); break;
        case FL_ALIGN_LEFT_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()-W, y()+h()-H, W, H); break;
        case FL_ALIGN_RIGHT_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w(), y()+h()-H, W, H); break;
        case FL_ALIGN_BOTTOM_LEFT:
          window()->damage(FL_DAMAGE_EXPOSE, x(), y()+h(), W, H); break;
        case FL_ALIGN_BOTTOM:
          window()->damage(FL_DAMAGE_EXPOSE, x()+(w()-W)/2, y()+h(), W, H); break;
        case FL_ALIGN_BOTTOM_RIGHT:
          window()->damage(FL_DAMAGE_EXPOSE, x()+w()-W, y()+h(), W, H); break;
        default:
          window()->damage(FL_DAMAGE_ALL); break;
      }
    } else {
      // The label is inside the widget, so just redraw the widget itself...
      damage(FL_DAMAGE_ALL);
    }
  }
}